

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O3

void __thiscall
amrex::DistributionMapping::RRSFCProcessorMap(DistributionMapping *this,BoxArray *boxes,int nprocs)

{
  element_type *peVar1;
  pointer piVar2;
  element_type *peVar3;
  
  peVar1 = (this->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar2 = *(pointer *)
            &(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl;
  if (*(pointer *)
       ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) != piVar2) {
    *(pointer *)
     ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) = piVar2;
  }
  piVar2 = (peVar1->m_index_array).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(peVar1->m_index_array).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) != piVar2) {
    *(pointer *)
     ((long)&(peVar1->m_index_array).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) = piVar2;
  }
  (((_Bit_iterator *)
   ((long)&(peVar1->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p =
       *(_Bit_type **)
        &(peVar1->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start;
  *(uint *)((long)&(peVar1->m_ownership).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data + 0x18) = 0;
  peVar3 = (boxes->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             (this->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             ((long)*(pointer *)
                     ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data + 8) -
              *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7);
  RRSFCDoIt(this,boxes,nprocs);
  return;
}

Assistant:

void
DistributionMapping::RRSFCProcessorMap (const BoxArray&          boxes,
                                        int                      nprocs)
{
    BL_ASSERT(boxes.size() > 0);

    m_ref->clear();
    m_ref->m_pmap.resize(boxes.size());

    RRSFCDoIt(boxes,nprocs);
}